

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int aec_decode(aec_stream_conflict *strm,int flush)

{
  internal_state_conflict *piVar1;
  int iVar2;
  
  strm->total_in = strm->total_in + strm->avail_in;
  strm->total_out = strm->total_out + strm->avail_out;
  piVar1 = strm->state;
  do {
    iVar2 = (*piVar1->mode)(strm);
  } while (iVar2 == 1);
  if (iVar2 == -1) {
    iVar2 = -3;
  }
  else if (((iVar2 == 0) && (strm->avail_out != 0)) &&
          (strm->avail_out < (ulong)piVar1->bytes_per_sample)) {
    iVar2 = -4;
  }
  else {
    (*piVar1->flush_output)(strm);
    strm->total_in = strm->total_in - strm->avail_in;
    strm->total_out = strm->total_out - strm->avail_out;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int aec_decode(struct aec_stream *strm, int flush)
{
    /**
       Finite-state machine implementation of the adaptive entropy
       decoder.

       Can work with one byte input und one sample output buffers. If
       enough buffer space is available, then faster implementations
       of the states are called. Inspired by zlib.
    */

    strm->total_in += strm->avail_in;
    strm->total_out += strm->avail_out;

    struct internal_state *state = strm->state;
    int status;
    do {
        status = state->mode(strm);
    } while (status == M_CONTINUE);

    if (status == M_ERROR)
        return AEC_DATA_ERROR;

    if (status == M_EXIT && strm->avail_out > 0 &&
        strm->avail_out < state->bytes_per_sample)
        return AEC_MEM_ERROR;

    state->flush_output(strm);

    strm->total_in -= strm->avail_in;
    strm->total_out -= strm->avail_out;

    return AEC_OK;
}